

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

bool __thiscall ON_PolyEdgeSegment::Write(ON_PolyEdgeSegment *this,ON_BinaryArchive *archive)

{
  ON_BinaryArchive *pOVar1;
  bool bVar2;
  ON_Interval local_48;
  ON_Interval local_38;
  undefined1 local_22;
  bool local_21;
  bool b;
  ON_BinaryArchive *pOStack_20;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_PolyEdgeSegment *this_local;
  
  pOStack_20 = archive;
  archive_local = (ON_BinaryArchive *)this;
  local_21 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (local_21) {
    local_21 = ON_BinaryArchive::WriteUuid(pOStack_20,&this->m_object_id);
    if ((((local_21) &&
         (local_21 = ON_BinaryArchive::WriteComponentIndex(pOStack_20,&this->m_component_index),
         local_21)) &&
        (local_21 = ON_BinaryArchive::WriteInterval(pOStack_20,&this->m_edge_domain), local_21)) &&
       (local_21 = ON_BinaryArchive::WriteInterval(pOStack_20,&this->m_trim_domain), local_21)) {
      local_22 = ON_CurveProxy::ProxyCurveIsReversed(&this->super_ON_CurveProxy);
      local_21 = ON_BinaryArchive::WriteBool(pOStack_20,(bool)local_22);
      pOVar1 = pOStack_20;
      if (local_21) {
        local_38 = ON_CurveProxy::Domain(&this->super_ON_CurveProxy);
        local_21 = ON_BinaryArchive::WriteInterval(pOVar1,&local_38);
        pOVar1 = pOStack_20;
        if (local_21) {
          local_48 = ON_CurveProxy::ProxyCurveDomain(&this->super_ON_CurveProxy);
          local_21 = ON_BinaryArchive::WriteInterval(pOVar1,&local_48);
        }
      }
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(pOStack_20);
    if (!bVar2) {
      local_21 = false;
    }
    this_local._7_1_ = (bool)(local_21 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_PolyEdgeSegment::Write( ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
  if (!rc)
    return false;
  for(;;)
  {
    rc = archive.WriteUuid(m_object_id);
    if (!rc) break;
    rc = archive.WriteComponentIndex(m_component_index);
    if (!rc) break;
    rc = archive.WriteInterval(m_edge_domain);
    if (!rc) break;
    rc = archive.WriteInterval(m_trim_domain);
    if (!rc) break;
    bool b = ON_CurveProxy::ProxyCurveIsReversed();
    rc = archive.WriteBool(b);
    if (!rc) break;
    rc = archive.WriteInterval(ON_CurveProxy::Domain());
    if (!rc) break;
    rc = archive.WriteInterval(ON_CurveProxy::ProxyCurveDomain());
    if (!rc) break;

    break;
  }
  if ( !archive.EndWrite3dmChunk() )
    rc = false;
  return rc;
}